

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceAABB.h
# Opt level: O2

void __thiscall IceMaths::AABB::Extend(AABB *this,Point *p)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Point local_20;
  Point local_10;
  
  local_20.z = (this->mCenter).z;
  fVar1 = (this->mExtents).z;
  local_10.z = local_20.z + fVar1;
  uVar2 = (this->mCenter).x;
  uVar4 = (this->mCenter).y;
  uVar3 = (this->mExtents).x;
  uVar5 = (this->mExtents).y;
  local_20.z = local_20.z - fVar1;
  fVar1 = p->x;
  local_10.x = (float)uVar2 + (float)uVar3;
  if ((float)uVar2 + (float)uVar3 < fVar1) {
    local_10.x = fVar1;
  }
  local_20.x = (float)uVar2 - (float)uVar3;
  if (fVar1 < (float)uVar2 - (float)uVar3) {
    local_20.x = fVar1;
  }
  fVar1 = p->y;
  local_10.y = (float)uVar4 + (float)uVar5;
  if ((float)uVar4 + (float)uVar5 < fVar1) {
    local_10.y = fVar1;
  }
  local_20.y = (float)uVar4 - (float)uVar5;
  if (fVar1 < (float)uVar4 - (float)uVar5) {
    local_20.y = fVar1;
  }
  fVar1 = p->z;
  if (local_10.z < fVar1) {
    local_10.z = fVar1;
  }
  if (fVar1 < local_20.z) {
    local_20.z = fVar1;
  }
  SetMinMax(this,&local_20,&local_10);
  return;
}

Assistant:

void		Extend(const Point& p)
									{
										Point Max = mCenter + mExtents;
										Point Min = mCenter - mExtents;

										if(p.x > Max.x)	Max.x = p.x;
										if(p.x < Min.x)	Min.x = p.x;

										if(p.y > Max.y)	Max.y = p.y;
										if(p.y < Min.y)	Min.y = p.y;

										if(p.z > Max.z)	Max.z = p.z;
										if(p.z < Min.z)	Min.z = p.z;

										SetMinMax(Min, Max);
									}